

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O3

Config * jaegertracing::reporters::Config::parse(Config *__return_storage_ptr__,Node *configYAML)

{
  bool bVar1;
  int queueSize;
  int iVar2;
  char (*in_R8) [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> localAgentHostPort;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> endpoint;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  duration local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((configYAML->m_isValid == true) &&
     (((configYAML->m_pNode == (node *)0x0 ||
       (*(char *)**(undefined8 **)configYAML->m_pNode == '\x01')) &&
      (bVar1 = YAML::Node::IsMap(configYAML), bVar1)))) {
    local_78._M_dataplus._M_p._0_4_ = 0;
    queueSize = utils::yaml::findOrDefault<int,char[10],int>
                          (configYAML,(char (*) [10])"queueSize",(int *)&local_78);
    local_78._M_dataplus._M_p = (pointer)((ulong)local_78._M_dataplus._M_p._4_4_ << 0x20);
    iVar2 = utils::yaml::findOrDefault<int,char[20],int>
                      (configYAML,(char (*) [20])"bufferFlushInterval",(int *)&local_78);
    local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffffffffff00;
    bVar1 = utils::yaml::findOrDefault<bool,char[9],bool>
                      (configYAML,(char (*) [9])"logSpans",(bool *)&local_78);
    utils::yaml::findOrDefault<std::__cxx11::string,char[19],char[1]>
              (&local_78,(yaml *)configYAML,(Node *)"localAgentHostPort",(char (*) [19])0x1e3f2c,
               in_R8);
    utils::yaml::findOrDefault<std::__cxx11::string,char[9],char[1]>
              (&local_50,(yaml *)configYAML,(Node *)"endpoint",(char (*) [9])0x1e3f2c,in_R8);
    local_58.__r = (long)iVar2 * 1000000000;
    Config(__return_storage_ptr__,queueSize,&local_58,bVar1,&local_78,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_58.__r = 10000000000;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"127.0.0.1:6831","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    Config(__return_storage_ptr__,100,&local_58,false,&local_78,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_78._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

static Config parse(const YAML::Node& configYAML)
    {
        if (!configYAML.IsDefined() || !configYAML.IsMap()) {
            return Config();
        }

        const auto queueSize =
            utils::yaml::findOrDefault<int>(configYAML, "queueSize", 0);
        const auto bufferFlushInterval =
            std::chrono::seconds(utils::yaml::findOrDefault<int>(
                configYAML, "bufferFlushInterval", 0));
        const auto logSpans =
            utils::yaml::findOrDefault<bool>(configYAML, "logSpans", false);
        const auto localAgentHostPort = utils::yaml::findOrDefault<std::string>(
            configYAML, "localAgentHostPort", "");
        const auto endpoint = utils::yaml::findOrDefault<std::string>(
            configYAML, "endpoint", "");
        return Config(
            queueSize, bufferFlushInterval, logSpans, localAgentHostPort, endpoint);
    }